

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::DirectStateAccess::Framebuffers::GetAttachmentParametersTest::iterate
          (GetAttachmentParametersTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  ContextType ctxType;
  deUint32 err;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    (**(code **)(CONCAT44(extraout_var,iVar8) + 0x78))(0x8d40,0);
    err = (**(code **)(CONCAT44(extraout_var,iVar8) + 0x800))();
    glu::checkError(err,"glBindFramebuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0xf87);
    bVar1 = TestDefaultFramebuffer(this);
    CreateRenderbufferFramebuffer(this,true,false);
    bVar2 = TestRenderbufferFramebuffer(this,false);
    Clean(this);
    CreateRenderbufferFramebuffer(this,false,true);
    bVar3 = TestRenderbufferFramebuffer(this,false);
    Clean(this);
    CreateRenderbufferFramebuffer(this,true,true);
    bVar4 = TestRenderbufferFramebuffer(this,true);
    Clean(this);
    CreateTextureFramebuffer(this,true,false);
    bVar5 = TestTextureFramebuffer(this,false);
    Clean(this);
    CreateTextureFramebuffer(this,false,true);
    bVar6 = TestTextureFramebuffer(this,false);
    Clean(this);
    CreateTextureFramebuffer(this,true,true);
    bVar7 = TestTextureFramebuffer(this,true);
    Clean(this);
    Clean(this);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if ((((((bVar1 && bVar2) && bVar3) && bVar4) && bVar5) && bVar6) && bVar7) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GetAttachmentParametersTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		/* Default framebuffer. */
		gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffers has failed");

		is_ok &= TestDefaultFramebuffer();

		/* Framebuffer object with renderbuffer attachments (depth only). */
		CreateRenderbufferFramebuffer(true, false);

		is_ok &= TestRenderbufferFramebuffer(false);

		Clean();

		/* Framebuffer object with renderbuffer attachments (stencil only). */
		CreateRenderbufferFramebuffer(false, true);

		is_ok &= TestRenderbufferFramebuffer(false);

		Clean();

		/* Framebuffer object with renderbuffer attachments (depth-stencil merged). */
		CreateRenderbufferFramebuffer(true, true);

		is_ok &= TestRenderbufferFramebuffer(true);

		Clean();

		/* Framebuffer object with texture attachments (depth only). */
		CreateTextureFramebuffer(true, false);

		is_ok &= TestTextureFramebuffer(false);

		Clean();

		/* Framebuffer object with texture attachments (stencil only). */
		CreateTextureFramebuffer(false, true);

		is_ok &= TestTextureFramebuffer(false);

		Clean();

		/* Framebuffer object with texture attachments (depth-stencil merged). */
		CreateTextureFramebuffer(true, true);

		is_ok &= TestTextureFramebuffer(true);

		Clean();
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean up. */
	Clean();

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}